

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  AppConfig config;
  int iVar1;
  ostream *poVar2;
  SceneInfo *sceneInfo;
  Application *renderer;
  long lVar3;
  long lVar4;
  Viewer viewer;
  string sceneFilePath;
  Application app;
  Viewer local_501;
  long local_500;
  long local_4f8;
  HDRImageBuffer *local_4f0;
  long local_4e8;
  long lStack_4e0;
  long local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  long local_4b8;
  HDRImageBuffer *pHStack_4b0;
  char *local_4a8;
  long local_4a0;
  Application local_488;
  
  local_500 = 4;
  local_4f8 = 1;
  local_4f0 = (HDRImageBuffer *)0x0;
  lVar3 = 1;
  lVar4 = 1;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = getopt(argc,argv,"s:l:t:m:e:h");
        if (iVar1 != 0x73) break;
        iVar1 = atoi(optarg);
        lVar4 = (long)iVar1;
      }
      if (iVar1 < 0x6c) break;
      if (iVar1 == 0x6c) {
        iVar1 = atoi(optarg);
        local_500 = (long)iVar1;
      }
      else if (iVar1 == 0x6d) {
        iVar1 = atoi(optarg);
        lVar3 = (long)iVar1;
      }
      else {
        if (iVar1 != 0x74) goto LAB_0019dada;
        iVar1 = atoi(optarg);
        local_4f8 = (long)iVar1;
      }
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x65) goto LAB_0019dada;
    local_4f0 = load_exr(optarg);
  }
  if (optind < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,argv[optind],(allocator<char> *)&local_488);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Scotty3D] ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Input scene file: ",0x12);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_4a8,local_4a0);
    std::endl<char,std::char_traits<char>>(poVar2);
    sceneInfo = (SceneInfo *)operator_new(0x18);
    (sceneInfo->nodes).
    super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (sceneInfo->nodes).
    super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (sceneInfo->nodes).
    super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar1 = CMU462::Collada::ColladaParser::load(local_4a8,sceneInfo);
    if (iVar1 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Scotty3D] ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: parsing failed!",0x16);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      CMU462::Collada::SceneInfo::~SceneInfo(sceneInfo);
      operator_delete(sceneInfo,0x18);
    }
    else {
      CMU462::Viewer::Viewer(&local_501);
      local_4d8 = local_500;
      uStack_4d0 = 1;
      local_4c8 = 1;
      uStack_4c0 = 1;
      local_4b8 = local_4f8;
      pHStack_4b0 = local_4f0;
      config.pathtracer_max_ray_depth = lVar3;
      config.pathtracer_ns_aa = lVar4;
      config.pathtracer_ns_area_light = local_500;
      config.pathtracer_ns_diff = 1;
      config.pathtracer_ns_glsy = 1;
      config.pathtracer_ns_refr = 1;
      config.pathtracer_num_threads = local_4f8;
      config.pathtracer_envmap = local_4f0;
      local_4e8 = lVar4;
      lStack_4e0 = lVar3;
      CMU462::Application::Application(&local_488,config);
      renderer = &local_488;
      CMU462::Viewer::set_renderer(&local_501,&renderer->super_Renderer);
      CMU462::Viewer::init(&local_501,(EVP_PKEY_CTX *)renderer);
      CMU462::Application::load(&local_488,sceneInfo);
      std::vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>::~vector
                ((vector<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_> *)sceneInfo)
      ;
      operator_delete(sceneInfo,0x18);
      CMU462::Viewer::start(&local_501);
    }
    exit(0);
  }
LAB_0019dada:
  usage(*argv);
  return 1;
}

Assistant:

int main( int argc, char** argv ) {

  // get the options
  AppConfig config; int opt;
  while ( (opt = getopt(argc, argv, "s:l:t:m:e:h")) != -1 ) {  // for each option...
    switch ( opt ) {
      case 's':
        config.pathtracer_ns_aa = atoi(optarg);
        break;
      case 'l':
        config.pathtracer_ns_area_light = atoi(optarg);
        break;
      case 't':
        config.pathtracer_num_threads = atoi(optarg);
        break;
      case 'm':
        config.pathtracer_max_ray_depth = atoi(optarg);
        break;
      case 'e':
        config.pathtracer_envmap = load_exr(optarg);
        break;
      default:
        usage(argv[0]);
        return 1;
    }
  }

  // print usage if no argument given
  if (optind >= argc) {
    usage(argv[0]);
    return 1;
  }

  string sceneFilePath = argv[optind];
  msg("Input scene file: " << sceneFilePath);

  // parse scene
  Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
  if (Collada::ColladaParser::load(sceneFilePath.c_str(), sceneInfo) < 0)
  {
    msg( "Error: parsing failed!" );
    delete sceneInfo;
    exit(0);
  }

  // create viewer
  Viewer viewer = Viewer();

  // create application
  Application app (config);

  // set renderer
  viewer.set_renderer(&app);

  // init viewer
  viewer.init();

  // load scene
  app.load(sceneInfo);


  delete sceneInfo;

  // NOTE (sky): are we copying everything to dynamic scene? If so:
  // TODO (sky): check and make sure the destructor is freeing everything

  // start viewer
  viewer.start();

  // TODO:
  // apparently the meshEdit renderer instance was not destroyed properly
  // not sure if this is due to the recent refactor but if anyone got some
  // free time, check the destructor for Application.
  exit(EXIT_SUCCESS); // shamelessly faking it

  return 0;

}